

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O3

void __thiscall asmjit::ZoneHashBase::_rehash(ZoneHashBase *this,uint32_t newCount)

{
  uint uVar1;
  uint32_t newCount_00;
  ZoneHashNode **p;
  ZoneHashNode *pZVar2;
  Zone *pZVar3;
  ZoneHashNode *pZVar4;
  ZoneHashNode **ppZVar5;
  uint32_t *puVar6;
  ZoneHeap *pZVar7;
  ulong extraout_RDX;
  Slot *pSVar8;
  ulong uVar9;
  undefined4 in_register_00000034;
  ZoneHeap *this_00;
  size_t sStack_28;
  
  pZVar7 = (ZoneHeap *)CONCAT44(in_register_00000034,newCount);
  this_00 = this->_heap;
  if (this_00 == (ZoneHeap *)0x0) {
    _rehash();
LAB_00119c40:
    _rehash();
LAB_00119c45:
    _rehash();
  }
  else {
    if (this_00->_zone == (Zone *)0x0) goto LAB_00119c40;
    p = this->_data;
    ppZVar5 = (ZoneHashNode **)ZoneHeap::_allocZeroed(this_00,(ulong)newCount << 3,&sStack_28);
    if (ppZVar5 == (ZoneHashNode **)0x0) {
      return;
    }
    uVar1 = this->_bucketsCount;
    this_00 = (ZoneHeap *)(ulong)uVar1;
    uVar9 = extraout_RDX;
    if (this_00 != (ZoneHeap *)0x0) {
      pZVar7 = (ZoneHeap *)0x0;
      do {
        pZVar4 = p[(long)pZVar7];
        while (pZVar4 != (ZoneHashNode *)0x0) {
          pZVar2 = *(ZoneHashNode **)pZVar4;
          uVar9 = (ulong)*(uint *)(pZVar4 + 8) % (ulong)newCount;
          *(ZoneHashNode **)pZVar4 = ppZVar5[uVar9];
          ppZVar5[uVar9] = pZVar4;
          pZVar4 = pZVar2;
        }
        pZVar7 = (ZoneHeap *)((long)&pZVar7->_zone + 1);
      } while (pZVar7 != this_00);
    }
    if (p == this->_embedded) {
LAB_00119c01:
      this->_bucketsCount = newCount;
      this->_bucketsGrow = (newCount * 9) / 10;
      this->_data = ppZVar5;
      return;
    }
    pZVar7 = this->_heap;
    if (pZVar7->_zone == (Zone *)0x0) goto LAB_00119c45;
    if (p != (ZoneHashNode **)0x0) {
      if (this_00 != (ZoneHeap *)0x0) {
        if (uVar1 < 0x41) {
          _rehash();
        }
        else {
          ZoneHeap::_releaseDynamic(pZVar7,p,uVar9);
        }
        goto LAB_00119c01;
      }
      goto LAB_00119c4f;
    }
  }
  _rehash();
LAB_00119c4f:
  _rehash();
  uVar1 = *(uint *)(this_00->_slots + 1);
  uVar9 = (ulong)*(uint *)pZVar7->_slots % (ulong)uVar1;
  pSVar8 = this_00->_slots[2];
  pZVar3 = (Zone *)pSVar8[uVar9].next;
  pZVar7->_zone = pZVar3;
  pSVar8[uVar9].next = (Slot *)pZVar7;
  pSVar8 = (Slot *)((long)&this_00->_slots[0]->next + 1);
  this_00->_slots[0] = pSVar8;
  if (((Slot *)(ulong)*(uint *)((long)this_00->_slots + 0xc) <= pSVar8) && (pZVar3 != (Zone *)0x0))
  {
    puVar6 = &ZoneHash_getClosestPrime(unsigned_int)::primeTable;
    uVar9 = 0;
    do {
      newCount_00 = *puVar6;
      if (8 < uVar9) break;
      uVar9 = uVar9 + 1;
      puVar6 = puVar6 + 1;
    } while (newCount_00 <= uVar1);
    if (newCount_00 != uVar1) {
      _rehash((ZoneHashBase *)this_00,newCount_00);
    }
  }
  return;
}

Assistant:

void ZoneHashBase::_rehash(uint32_t newCount) noexcept {
  ASMJIT_ASSERT(isInitialized());

  ZoneHashNode** oldData = _data;
  ZoneHashNode** newData = reinterpret_cast<ZoneHashNode**>(
    _heap->allocZeroed(static_cast<size_t>(newCount) * sizeof(ZoneHashNode*)));

  // We can still store nodes into the table, but it will degrade.
  if (ASMJIT_UNLIKELY(newData == nullptr))
    return;

  uint32_t i;
  uint32_t oldCount = _bucketsCount;

  for (i = 0; i < oldCount; i++) {
    ZoneHashNode* node = oldData[i];
    while (node) {
      ZoneHashNode* next = node->_hashNext;
      uint32_t hMod = node->_hVal % newCount;

      node->_hashNext = newData[hMod];
      newData[hMod] = node;

      node = next;
    }
  }

  // 90% is the maximum occupancy, can't overflow since the maximum capacity
  // is limited to the last prime number stored in the prime table.
  if (oldData != _embedded)
    _heap->release(oldData, _bucketsCount * sizeof(ZoneHashNode*));

  _bucketsCount = newCount;
  _bucketsGrow = newCount * 9 / 10;

  _data = newData;
}